

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

X509DerReaderPtr __thiscall QTlsBackend::X509DerReader(QTlsBackend *this)

{
  bool bVar1;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff88;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff90;
  int line;
  QMessageLogger *this_00;
  QDebug *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffd8;
  QDebug local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QtPrivateLogging::lcSsl();
  anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x27735c);
    QMessageLogger::QMessageLogger
              (this_00,(char *)in_RDI,line,(char *)in_stack_ffffffffffffff88,(char *)0x277372);
    QMessageLogger::warning();
    in_stack_ffffffffffffff90 =
         (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
         QDebug::operator<<(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd8);
    (**(code **)(*(long *)&in_RDI->context + 0x90))(&stack0xffffffffffffffa8);
    QDebug::operator<<((QDebug *)this_00,(QString *)in_RDI);
    QDebug::operator<<(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd8);
    QString::~QString((QString *)0x2773d2);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (X509DerReaderPtr)0x0;
  }
  __stack_chk_fail();
}

Assistant:

QTlsPrivate::X509DerReaderPtr QTlsBackend::X509DerReader() const
{
    REPORT_MISSING_SUPPORT("cannot read DER format");
    return nullptr;
}